

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O0

MPP_RET hal_h264e_vepu580_init(void *hal,MppEncHalCfg *cfg)

{
  MppEncCfgSet *pMVar1;
  void *pvVar2;
  HalH264eVepu580Tune *pHVar3;
  MppEncHwCfg *hw;
  RK_U32 i;
  MPP_RET ret;
  HalH264eVepu580Ctx *p;
  MppEncHalCfg *cfg_local;
  void *hal_local;
  
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_init",hal);
  }
  *(MppEncCfgSet **)hal = cfg->cfg;
  mpp_env_get_u32("disable_rcb_buf",&disable_rcb_buf,0);
  cfg->type = VPU_CLIENT_RKVENC;
  hw._4_4_ = mpp_dev_init(&cfg->dev,cfg->type);
  if (hw._4_4_ == MPP_OK) {
    *(MppDev *)((long)hal + 8) = cfg->dev;
    *(RK_S32 *)((long)hal + 0x14) = cfg->task_cnt;
    if (((*(int *)((long)hal + 0x14) == 0) || (2 < *(uint *)((long)hal + 0x14))) &&
       (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "p->task_cnt && p->task_cnt <= 2","hal_h264e_vepu580_init",0x136),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    hw._4_4_ = hal_bufs_init((HalBufs *)((long)hal + 0x18));
    if (hw._4_4_ == MPP_OK) {
      pvVar2 = mpp_osal_malloc("hal_h264e_vepu580_init",(ulong)*(uint *)((long)hal + 0x14) * 0x1cb8)
      ;
      *(void **)((long)hal + 0x1a0) = pvVar2;
      if (*(long *)((long)hal + 0x1a0) == 0) {
        hw._4_4_ = MPP_ERR_MALLOC;
        _mpp_log_l(2,"hal_h264e_vepu580","init register buffer failed\n","hal_h264e_vepu580_init");
      }
      else {
        pvVar2 = mpp_osal_malloc("hal_h264e_vepu580_init",(ulong)*(uint *)((long)hal + 0x14) * 0x60)
        ;
        *(void **)((long)hal + 0x1a8) = pvVar2;
        if (*(long *)((long)hal + 0x1a8) == 0) {
          hw._4_4_ = MPP_ERR_MALLOC;
          _mpp_log_l(2,"hal_h264e_vepu580","init amend data failed\n","hal_h264e_vepu580_init");
        }
        else {
          if (1 < *(uint *)((long)hal + 0x14)) {
            pvVar2 = mpp_osal_malloc("hal_h264e_vepu580_init",
                                     (ulong)*(uint *)((long)hal + 0x14) * 0x28);
            *(void **)((long)hal + 0x1b0) = pvVar2;
            if (*(long *)((long)hal + 0x1b0) == 0) {
              hw._4_4_ = MPP_ERR_MALLOC;
              _mpp_log_l(2,"hal_h264e_vepu580","init amend data failed\n","hal_h264e_vepu580_init");
              goto LAB_002b651d;
            }
            pvVar2 = mpp_osal_malloc("hal_h264e_vepu580_init",
                                     (ulong)*(uint *)((long)hal + 0x14) * 0x90);
            *(void **)((long)hal + 0x1b8) = pvVar2;
            if (*(long *)((long)hal + 0x1b8) == 0) {
              hw._4_4_ = MPP_ERR_MALLOC;
              _mpp_log_l(2,"hal_h264e_vepu580","init amend data failed\n","hal_h264e_vepu580_init");
              goto LAB_002b651d;
            }
            pvVar2 = mpp_osal_malloc("hal_h264e_vepu580_init",0x10c);
            *(void **)((long)hal + 0x80) = pvVar2;
            if (*(long *)((long)hal + 0x80) == 0) {
              hw._4_4_ = MPP_ERR_MALLOC;
              _mpp_log_l(2,"hal_h264e_vepu580","init amend data failed\n","hal_h264e_vepu580_init");
              goto LAB_002b651d;
            }
            pvVar2 = mpp_osal_malloc("hal_h264e_vepu580_init",0xbc);
            *(void **)((long)hal + 0x88) = pvVar2;
            if (*(long *)((long)hal + 0x88) == 0) {
              hw._4_4_ = MPP_ERR_MALLOC;
              _mpp_log_l(2,"hal_h264e_vepu580","init amend data failed\n","hal_h264e_vepu580_init");
              goto LAB_002b651d;
            }
          }
          *(undefined4 *)((long)hal + 0x200) = 8;
          *(int *)((long)hal + 0x204) = *(int *)((long)hal + 0x200) * 4 + 8;
          pvVar2 = mpp_osal_malloc("hal_h264e_vepu580_init",
                                   (ulong)(uint)(*(int *)((long)hal + 0x204) *
                                                *(int *)((long)hal + 0x14)));
          *(void **)((long)hal + 0x208) = pvVar2;
          if (*(long *)((long)hal + 0x208) == 0) {
            hw._4_4_ = MPP_ERR_MALLOC;
            _mpp_log_l(2,"hal_h264e_vepu580","init poll cfg buffer failed\n",
                       "hal_h264e_vepu580_init");
          }
          else {
            *(long *)((long)hal + 0x138) = *(long *)((long)hal + 0x1a0) + 0x1210;
            *(undefined8 *)((long)hal + 0x140) = *(undefined8 *)((long)hal + 8);
            *(undefined8 *)((long)hal + 0x148) = 0;
            *(long *)((long)hal + 0x150) = *hal + 0x1438;
            *(undefined8 *)((long)hal + 0x158) = 0;
            *(undefined8 *)((long)hal + 0x160) = 0;
            pMVar1 = cfg->cfg;
            (pMVar1->hw).qp_delta_row_i = 2;
            (pMVar1->hw).qp_delta_row = 2;
            (pMVar1->hw).extra_buf = 1;
            (pMVar1->hw).qbias_i = 0x2ab;
            (pMVar1->hw).qbias_p = 0x155;
            (pMVar1->hw).qbias_en = 0;
            memcpy((pMVar1->hw).aq_thrd_i,h264_aq_tthd_default,0x40);
            memcpy((pMVar1->hw).aq_thrd_p,h264_aq_tthd_default,0x40);
            memcpy((pMVar1->hw).aq_step_i,h264_I_aq_step_default,0x40);
            memcpy((pMVar1->hw).aq_step_p,h264_P_aq_step_default,0x40);
            for (hw._0_4_ = 0; (uint)hw < 8; hw._0_4_ = (uint)hw + 1) {
              (pMVar1->hw).mode_bias[(uint)hw] = 8;
            }
            (pMVar1->hw).skip_sad = 8;
            (pMVar1->hw).skip_bias = 8;
            mpp_dev_multi_offset_init((MppDevRegOffCfgs **)((long)hal + 0x38),0x18);
            *(undefined8 *)((long)hal + 0x148) = *(undefined8 *)((long)hal + 0x38);
            pHVar3 = vepu580_h264e_tune_init((HalH264eVepu580Ctx *)hal);
            *(HalH264eVepu580Tune **)((long)hal + 0x168) = pHVar3;
            *(MppCbCtx **)((long)hal + 0x1f8) = cfg->output_cb;
            cfg->cap_recn_out = 1;
            for (hw._0_4_ = 0; (uint)hw < *(uint *)((long)hal + 0x14); hw._0_4_ = (uint)hw + 1) {
              h264e_vepu_stream_amend_init
                        ((HalH264eVepuStreamAmend *)
                         (*(long *)((long)hal + 0x1a8) + (ulong)(uint)hw * 0x60));
            }
          }
        }
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu580","init vepu buffer failed ret: %d\n","hal_h264e_vepu580_init",
                 (ulong)(uint)hw._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_h264e_vepu580","mpp_dev_init failed. ret: %d\n","hal_h264e_vepu580_init",
               (ulong)(uint)hw._4_4_);
  }
LAB_002b651d:
  if (hw._4_4_ != MPP_OK) {
    hal_h264e_vepu580_deinit(hal);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p\n","hal_h264e_vepu580_init",hal);
  }
  return hw._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu580_init(void *hal, MppEncHalCfg *cfg)
{
    HalH264eVepu580Ctx *p = (HalH264eVepu580Ctx *)hal;
    MPP_RET ret = MPP_OK;
    RK_U32 i;

    hal_h264e_dbg_func("enter %p\n", p);

    p->cfg = cfg->cfg;

    mpp_env_get_u32("disable_rcb_buf", &disable_rcb_buf, 0);

    /* update output to MppEnc */
    cfg->type = VPU_CLIENT_RKVENC;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        goto DONE;
    }
    p->dev = cfg->dev;
    p->task_cnt = cfg->task_cnt;
    mpp_assert(p->task_cnt && p->task_cnt <= MAX_TASK_CNT);

    ret = hal_bufs_init(&p->hw_recn);
    if (ret) {
        mpp_err_f("init vepu buffer failed ret: %d\n", ret);
        goto DONE;
    }

    p->regs_sets = mpp_malloc(HalVepu580RegSet, p->task_cnt);
    if (NULL == p->regs_sets) {
        ret = MPP_ERR_MALLOC;
        mpp_err_f("init register buffer failed\n");
        goto DONE;
    }
    p->amend_sets = mpp_malloc(HalH264eVepuStreamAmend, p->task_cnt);
    if (NULL == p->amend_sets) {
        ret = MPP_ERR_MALLOC;
        mpp_err_f("init amend data failed\n");
        goto DONE;
    }

    if (p->task_cnt > 1) {
        p->prefix_sets = mpp_malloc(H264ePrefixNal, p->task_cnt);
        if (NULL == p->prefix_sets) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }

        p->slice_sets = mpp_malloc(H264eSlice, p->task_cnt);
        if (NULL == p->slice_sets) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }

        p->reorder = mpp_malloc(H264eReorderInfo, 1);
        if (NULL == p->reorder) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }

        p->marking = mpp_malloc(H264eMarkingInfo, 1);
        if (NULL == p->marking) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }
    }

    p->poll_slice_max = 8;
    p->poll_cfg_size = (sizeof(p->poll_cfgs) + sizeof(RK_S32) * p->poll_slice_max);
    p->poll_cfgs = mpp_malloc_size(MppDevPollCfg, p->poll_cfg_size * p->task_cnt);
    if (NULL == p->poll_cfgs) {
        ret = MPP_ERR_MALLOC;
        mpp_err_f("init poll cfg buffer failed\n");
        goto DONE;
    }

    p->osd_cfg.reg_base = &p->regs_sets->reg_osd;
    p->osd_cfg.dev = p->dev;
    p->osd_cfg.reg_cfg = NULL;
    p->osd_cfg.plt_cfg = &p->cfg->plt_cfg;
    p->osd_cfg.osd_data = NULL;
    p->osd_cfg.osd_data2 = NULL;

    {   /* setup default hardware config */
        MppEncHwCfg *hw = &cfg->cfg->hw;

        hw->qp_delta_row_i  = 2;
        hw->qp_delta_row    = 2;
        hw->extra_buf       = 1;
        hw->qbias_i         = 683;
        hw->qbias_p         = 341;
        hw->qbias_en        = 0;

        memcpy(hw->aq_thrd_i, h264_aq_tthd_default, sizeof(hw->aq_thrd_i));
        memcpy(hw->aq_thrd_p, h264_aq_tthd_default, sizeof(hw->aq_thrd_p));
        memcpy(hw->aq_step_i, h264_I_aq_step_default, sizeof(hw->aq_step_i));
        memcpy(hw->aq_step_p, h264_P_aq_step_default, sizeof(hw->aq_step_p));

        for (i = 0; i < MPP_ARRAY_ELEMS(hw->mode_bias); i++)
            hw->mode_bias[i] = 8;

        hw->skip_sad  = 8;
        hw->skip_bias = 8;
    }
    mpp_dev_multi_offset_init(&p->offsets, 24);
    p->osd_cfg.reg_cfg = p->offsets;

    p->tune = vepu580_h264e_tune_init(p);
    p->output_cb = cfg->output_cb;

    cfg->cap_recn_out = 1;

    for (i = 0; i < p->task_cnt; i++)
        h264e_vepu_stream_amend_init(&p->amend_sets[i]);

DONE:
    if (ret)
        hal_h264e_vepu580_deinit(hal);

    hal_h264e_dbg_func("leave %p\n", p);
    return ret;
}